

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_5450::TlbExportVisitor::visit_(TlbExportVisitor *this,Compound *type)

{
  size_type *psVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  Indent indenter;
  Indent local_88;
  string local_60;
  anon_unknown_dwarf_5450 *local_40;
  string *local_38;
  anon_unknown_dwarf_5450 local_30 [16];
  
  poVar2 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<compound name=\"",0x10);
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape((string *)&local_88,local_40,local_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_88.m_indent,(long)local_88.m_save._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" size=\"",8);
  Typelib::Type::getSize();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
            (&local_60,(this->m_source_id)._M_dataplus._M_p);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  psVar1 = &local_88.m_save._M_string_length;
  if (local_88.m_indent != (string *)psVar1) {
    operator_delete(local_88.m_indent);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  Indent::Indent(&local_88,&this->m_indent);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent(&local_88);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  auVar3 = Typelib::Type::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            ((string *)&local_88,auVar3._0_8_,auVar3._8_8_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_88.m_indent,(long)local_88.m_save._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_88.m_indent != (string *)psVar1) {
    operator_delete(local_88.m_indent);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</compound>",0xb);
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type)
    {
        m_stream << "<compound name=\"" << xmlEscape(type.getName()) << "\" size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</compound>";

        return true;
    }